

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

bool __thiscall
lzham::lzcompressor::optimal_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  search_accelerator *dict;
  uint *puVar1;
  node *__s;
  vector<lzham::lzcompressor::lzdecision> *pvVar2;
  int iVar3;
  uint is_match_model_index;
  state *this_00;
  uchar *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  uint *puVar7;
  node_state *pnVar8;
  uint uVar9;
  char cVar10;
  char cVar11;
  uint lit_pred0;
  uint uVar12;
  uint uVar13;
  bit_cost_t bVar14;
  ulong uVar15;
  dict_match *pdVar16;
  lzdecision *plVar17;
  uint uVar18;
  uint uVar19;
  uint *lzdec;
  long lVar20;
  lzdecision *plVar22;
  uint l;
  uint uVar23;
  uint uVar24;
  ulong uVar25;
  undefined2 uVar26;
  uint uVar27;
  uint uVar28;
  node *pnVar29;
  ulong uVar30;
  uint uVar31;
  ulong uVar32;
  uint uVar33;
  long lVar34;
  node *pnVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  uint local_cd8;
  uint local_cd4;
  uint match_distances [128];
  uint match_lens [128];
  bit_cost_t lzdec_bitcosts [258];
  ulong uVar21;
  
  (parse_state->super_raw_parse_thread_state).m_failed = false;
  (parse_state->super_raw_parse_thread_state).m_emit_decisions_backwards = true;
  __s = (parse_state->super_raw_parse_thread_state).m_nodes;
  *(undefined2 *)
   ((long)&(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_cost + 4)
       = 0xffff;
  *(undefined8 *)
   ((parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.
    m_match_hist + 3) = 0;
  *(undefined4 *)
   &(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_cost = 0;
  this_00 = (parse_state->super_raw_parse_thread_state).m_pState;
  local_cd8 = (parse_state->super_raw_parse_thread_state).m_start_ofs;
  uVar28 = (parse_state->super_raw_parse_thread_state).m_bytes_to_match;
  dict = &this->m_accel;
  local_cd4 = local_cd8 - ((this->m_accel).m_max_dict_size_mask & (this->m_accel).m_lookahead_pos);
  puVar1 = (this_00->super_state_base).m_match_hist;
  uVar15 = 0;
  pnVar35 = __s;
  do {
    uVar19 = (uint)uVar15;
    uVar27 = uVar28 - uVar19;
    if (uVar28 < uVar19 || uVar27 == 0) break;
    lzdec = &__s->m_node_states[uVar15 - 1].m_total_complexity;
    bVar36 = uVar19 < (parse_state->super_raw_parse_thread_state).m_parse_early_out_thresh;
    bVar38 = (node *)lzdec != pnVar35;
    if (bVar38 || bVar36) {
      uVar24 = 0x101;
      if (uVar27 < 0x101) {
        uVar24 = uVar27;
      }
      uVar13 = (this->m_accel).m_cur_dict_size;
      if (uVar19 != 0) {
        (this_00->super_state_base).m_cur_ofs = lzdec[3];
        (this_00->super_state_base).m_cur_state = lzdec[4];
        uVar6 = *(undefined8 *)(lzdec + 7);
        *(undefined8 *)puVar1 = *(undefined8 *)(lzdec + 5);
        *(undefined8 *)((this_00->super_state_base).m_match_hist + 2) = uVar6;
        state_base::partial_advance(&this_00->super_state_base,(lzdecision *)lzdec);
      }
      lVar20 = *(long *)(lzdec + 10);
      iVar3 = lzdec[0xc];
      uVar23 = 1;
      lit_pred0 = state::get_pred_char(this_00,dict,local_cd8,1);
      is_match_model_index = (this_00->super_state_base).m_cur_state;
      puVar4 = (this->m_accel).m_dict.m_p;
      uVar18 = uVar27;
      if (0x100 < uVar27) {
        uVar18 = 0x101;
      }
      lVar34 = 0;
      uVar21 = 0;
      do {
        uVar32 = 0;
        if ((puVar1[lVar34] <= uVar13 + local_cd4) && (uVar32 = 0, uVar28 != uVar19)) {
          uVar32 = 0;
          do {
            if ((this->m_accel).m_dict.m_p
                [uVar32 + ((local_cd4 - puVar1[lVar34]) + (this->m_accel).m_lookahead_pos &
                          (this->m_accel).m_max_dict_size_mask)] != puVar4[uVar32 + local_cd8])
            goto LAB_00108aaf;
            uVar32 = uVar32 + 1;
          } while (uVar18 + (uVar18 == 0) != (int)uVar32);
          uVar32 = (ulong)(uVar24 + (uVar24 == 0));
        }
LAB_00108aaf:
        uVar31 = (uint)uVar32;
        uVar26 = (undefined2)uVar15;
        uVar25 = uVar21;
        if (uVar23 <= uVar31) {
          uVar33 = (uint)lVar34;
          state::get_rep_match_costs
                    (this_00,local_cd8,lzdec_bitcosts,uVar33,uVar23,uVar31,is_match_model_index);
          uVar12 = iVar3 + 2 + uVar33;
          pnVar29 = (node *)(lzdec + (ulong)uVar23 * 0xe);
          uVar25 = (ulong)uVar23;
          do {
            uVar30 = lzdec_bitcosts[uVar25] + lVar20;
            uVar5 = *(ulong *)((long)pnVar29->m_node_states[0].m_saved_state.m_match_hist + 0xc);
            if ((uVar30 <= uVar5) &&
               ((uVar30 != uVar5 || (uVar12 < (uint)pnVar29->m_node_states[0].m_total_cost)))) {
              *(ulong *)((long)pnVar29->m_node_states[0].m_saved_state.m_match_hist + 0xc) = uVar30;
              *(uint *)&pnVar29->m_node_states[0].m_total_cost = uVar12;
              *(undefined2 *)((long)&pnVar29->m_node_states[0].m_total_cost + 4) = uVar26;
              pnVar29->m_node_states[0].m_lzdec.m_len = (this_00->super_state_base).m_cur_ofs;
              pnVar29->m_node_states[0].m_lzdec.m_dist = (this_00->super_state_base).m_cur_state;
              uVar9 = puVar1[1];
              uVar6 = *(undefined8 *)((this_00->super_state_base).m_match_hist + 2);
              pnVar29->m_node_states[0].m_saved_state.m_cur_ofs = puVar1[0];
              pnVar29->m_node_states[0].m_saved_state.m_cur_state = uVar9;
              *(undefined8 *)pnVar29->m_node_states[0].m_saved_state.m_match_hist = uVar6;
              pnVar29->m_num_node_states = local_cd8;
              *(int *)&pnVar29->field_0x4 = (int)uVar25;
              pnVar29->m_node_states[0].m_lzdec.m_pos = ~uVar33;
              if (pnVar35 < pnVar29) {
                pnVar35 = pnVar29;
              }
            }
            pnVar29 = (node *)&pnVar29->m_node_states[0].m_total_complexity;
            bVar37 = uVar25 < (uVar32 & 0xffffffff);
            uVar25 = uVar25 + 1;
          } while (bVar37);
          uVar25 = uVar32 & 0xffffffff;
          if (uVar31 < (uint)uVar21) {
            uVar25 = uVar21;
          }
        }
        uVar31 = (uint)uVar25;
        lVar34 = lVar34 + 1;
        uVar23 = 2;
        uVar21 = uVar25;
      } while (lVar34 != 4);
      if (uVar31 < this->m_fast_bytes) {
        if (1 < uVar27) {
          if ((uVar31 < 2) &&
             (uVar13 = search_accelerator::get_len2_match(dict,local_cd4), uVar13 != 0)) {
            bVar14 = state::get_len2_match_cost
                               (this_00,&this->super_CLZBase,local_cd8,uVar13,is_match_model_index);
            uVar15 = bVar14 + lVar20;
            if ((uVar15 < *(ulong *)(lzdec + 0x26)) ||
               ((uVar15 == *(ulong *)(lzdec + 0x26) && (iVar3 + 7U < lzdec[0x28])))) {
              *(ulong *)(lzdec + 0x26) = uVar15;
              lzdec[0x28] = iVar3 + 7U;
              *(undefined2 *)(lzdec + 0x29) = uVar26;
              lzdec[0x1f] = (this_00->super_state_base).m_cur_ofs;
              lzdec[0x20] = (this_00->super_state_base).m_cur_state;
              uVar6 = *(undefined8 *)((this_00->super_state_base).m_match_hist + 2);
              *(undefined8 *)(lzdec + 0x21) = *(undefined8 *)puVar1;
              *(undefined8 *)(lzdec + 0x23) = uVar6;
              lzdec[0x1c] = local_cd8;
              lzdec[0x1d] = 2;
              lzdec[0x1e] = uVar13;
              if (pnVar35 < lzdec + 0x1c) {
                pnVar35 = (node *)(lzdec + 0x1c);
              }
            }
            uVar25 = 2;
          }
          uVar27 = (uint)uVar25;
          pdVar16 = search_accelerator::find_matches(dict,local_cd4,true);
          if (pdVar16 == (dict_match *)0x0) {
            uVar18 = 0;
            uVar31 = uVar27;
          }
          else {
            uVar18 = 0;
            do {
              uVar23 = pdVar16->m_len + 2;
              if (uVar24 <= uVar23) {
                uVar23 = uVar24;
              }
              if ((uint)uVar25 < uVar23) {
                match_lens[uVar18] = uVar23;
                match_distances[uVar18] = pdVar16->m_dist & 0x7fffffff;
                uVar18 = uVar18 + 1;
                uVar25 = (ulong)uVar23;
              }
              uVar31 = (uint)uVar25;
              puVar7 = &pdVar16->m_dist;
              pdVar16 = pdVar16 + 1;
            } while (-1 < (int)*puVar7);
          }
          if (uVar18 != 0) {
            uVar27 = uVar27 + (uVar27 == 0);
            uVar15 = 0;
            do {
              uVar24 = uVar27 + 1;
              uVar27 = match_lens[uVar15];
              uVar13 = match_distances[uVar15];
              state::get_full_match_costs
                        (this_00,&this->super_CLZBase,local_cd8,lzdec_bitcosts,uVar13,uVar24,uVar27,
                         is_match_model_index);
              for (; uVar24 <= uVar27; uVar24 = uVar24 + 1) {
                uVar21 = (ulong)uVar24;
                pnVar29 = (node *)(lzdec + uVar21 * 0xe);
                uVar32 = lzdec_bitcosts[uVar21] + lVar20;
                uVar23 = (uVar24 < 9) + 6 + iVar3;
                if ((uVar32 <= *(ulong *)(lzdec + uVar21 * 0xe + 10)) &&
                   ((uVar32 != *(ulong *)(lzdec + uVar21 * 0xe + 10) ||
                    (uVar23 < (uint)pnVar29->m_node_states[0].m_total_cost)))) {
                  *(ulong *)((long)pnVar29->m_node_states[0].m_saved_state.m_match_hist + 0xc) =
                       uVar32;
                  *(uint *)&pnVar29->m_node_states[0].m_total_cost = uVar23;
                  *(undefined2 *)((long)&pnVar29->m_node_states[0].m_total_cost + 4) = uVar26;
                  pnVar29->m_node_states[0].m_lzdec.m_len = (this_00->super_state_base).m_cur_ofs;
                  pnVar29->m_node_states[0].m_lzdec.m_dist = (this_00->super_state_base).m_cur_state
                  ;
                  uVar33 = puVar1[1];
                  uVar6 = *(undefined8 *)((this_00->super_state_base).m_match_hist + 2);
                  pnVar29->m_node_states[0].m_saved_state.m_cur_ofs = puVar1[0];
                  pnVar29->m_node_states[0].m_saved_state.m_cur_state = uVar33;
                  *(undefined8 *)pnVar29->m_node_states[0].m_saved_state.m_match_hist = uVar6;
                  pnVar29->m_num_node_states = local_cd8;
                  *(uint *)&pnVar29->field_0x4 = uVar24;
                  pnVar29->m_node_states[0].m_lzdec.m_pos = uVar13;
                  if (pnVar35 < pnVar29) {
                    pnVar35 = pnVar29;
                  }
                }
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 != uVar18);
          }
        }
        if (uVar31 < this->m_fast_bytes) {
          bVar14 = state::get_lit_cost(this_00,&this->super_CLZBase,dict,local_cd8,lit_pred0,
                                       is_match_model_index);
          uVar15 = bVar14 + lVar20;
          if ((uVar15 < *(ulong *)(lzdec + 0x18)) ||
             ((uVar31 = 1, uVar15 == *(ulong *)(lzdec + 0x18) && (iVar3 + 1U < lzdec[0x1a])))) {
            *(ulong *)(lzdec + 0x18) = uVar15;
            lzdec[0x1a] = iVar3 + 1U;
            *(undefined2 *)(lzdec + 0x1b) = uVar26;
            lzdec[0x11] = (this_00->super_state_base).m_cur_ofs;
            lzdec[0x12] = (this_00->super_state_base).m_cur_state;
            uVar6 = *(undefined8 *)((this_00->super_state_base).m_match_hist + 2);
            *(undefined8 *)(lzdec + 0x13) = *(undefined8 *)puVar1;
            *(undefined8 *)(lzdec + 0x15) = uVar6;
            lzdec[0xe] = local_cd8;
            *(undefined8 *)(lzdec + 0xf) = 0;
            if (pnVar35 < lzdec + 0xe) {
              pnVar35 = (node *)(lzdec + 0xe);
            }
            uVar31 = 1;
          }
        }
      }
      local_cd8 = local_cd8 + uVar31;
      local_cd4 = local_cd4 + uVar31;
      uVar15 = (ulong)(uVar19 + uVar31);
    }
  } while (bVar38 || bVar36);
  pvVar2 = &(parse_state->super_raw_parse_thread_state).m_best_decisions;
  uVar28 = (uint)pvVar2;
  cVar10 = lzham::elemental_vector::increase_capacity
                     (uVar28,SUB81(uVar15,0),1,(_func_void_void_ptr_void_ptr_uint *)0xc,true);
  if (cVar10 == '\0') {
    (parse_state->super_raw_parse_thread_state).m_failed = true;
  }
  else {
    plVar17 = pvVar2->m_p;
    uVar21 = uVar15;
    plVar22 = plVar17;
    do {
      lVar20 = (long)(int)uVar21;
      plVar22->m_dist =
           (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[lVar20].m_lzdec.
           m_pos;
      pnVar8 = __s->m_node_states + lVar20 + -1;
      uVar6._0_4_ = pnVar8->m_total_complexity;
      uVar6._4_2_ = pnVar8->m_parent_index;
      uVar6._6_1_ = pnVar8->m_parent_state_index;
      uVar6._7_1_ = pnVar8->field_0x37;
      plVar22->m_pos = (undefined4)uVar6;
      plVar22->m_len = (int)((ulong)uVar6 >> 0x20);
      plVar22 = plVar22 + 1;
      uVar19 = (uint)*(short *)((long)&(parse_state->super_raw_parse_thread_state).m_nodes[0].
                                       m_node_states[lVar20].m_total_cost + 4);
      uVar21 = (ulong)uVar19;
      plVar17 = plVar17 + 1;
    } while (0 < (int)uVar19);
    uVar19 = (int)((ulong)((long)plVar17 -
                          (long)(parse_state->super_raw_parse_thread_state).m_best_decisions.m_p) >>
                  2) * -0x55555555;
    if ((uVar19 <= (parse_state->super_raw_parse_thread_state).m_best_decisions.m_capacity) ||
       (cVar11 = lzham::elemental_vector::increase_capacity
                           (uVar28,SUB41(uVar19,0),
                            (uint)((parse_state->super_raw_parse_thread_state).m_best_decisions.
                                   m_size + 1 == uVar19),(_func_void_void_ptr_void_ptr_uint *)0xc,
                            true), cVar11 != '\0')) {
      (parse_state->super_raw_parse_thread_state).m_best_decisions.m_size = uVar19;
    }
    (parse_state->super_raw_parse_thread_state).m_bytes_actually_parsed = (uint)uVar15;
  }
  memset(__s,0xff,(long)pnVar35 + (0x38 - (long)__s));
  return (bool)cVar10;
}

Assistant:

bool lzcompressor::optimal_parse(parse_thread_state &parse_state)
   {
      LZHAM_ASSERT(parse_state.m_bytes_to_match <= cMaxParseGraphNodes);

      parse_state.m_failed = false;
      parse_state.m_emit_decisions_backwards = true;

      node_state *pNodes = reinterpret_cast<node_state*>(parse_state.m_nodes);
      pNodes[0].m_parent_index = -1;
      pNodes[0].m_total_cost = 0;
      pNodes[0].m_total_complexity = 0;

#ifdef LZHAM_BUILD_DEBUG
      for (uint i = 1; i < (cMaxParseGraphNodes + 1); i++)
      {
         LZHAM_ASSERT(pNodes[i].m_total_cost == cUINT64_MAX);
         LZHAM_ASSERT(pNodes[i].m_total_complexity == UINT_MAX);
         LZHAM_ASSERT(pNodes[i].m_parent_index == -1);
      }
#endif

      state &approx_state = *parse_state.m_pState;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_node_index = 0;

      enum { cMaxFullMatches = cMatchAccelMaxSupportedProbes };
      uint match_lens[cMaxFullMatches];
      uint match_distances[cMaxFullMatches];

      bit_cost_t lzdec_bitcosts[cMaxMatchLen + 1];

      node_state *pMax_node_in_graph = &pNodes[0];

      while (cur_node_index < bytes_to_parse)
      {
         node_state* pCur_node = &pNodes[cur_node_index];

         if ((cur_node_index >= parse_state.m_parse_early_out_thresh) && (pCur_node == pMax_node_in_graph))
         {
            // If the best path *must* pass through this node, and we're far enough along, and we're parsing using a single thread, then exit so we can move all our state forward.
            break;
         }

         const uint max_admissable_match_len = LZHAM_MIN(static_cast<uint>(CLZBase::cMaxMatchLen), bytes_to_parse - cur_node_index);
         const uint find_dict_size = m_accel.m_cur_dict_size + cur_lookahead_ofs;

         if (cur_node_index)
         {
            LZHAM_ASSERT(pCur_node->m_parent_index >= 0);

            // Move to this node's state using the lowest cost LZ decision found.
            approx_state.restore_partial_state(pCur_node->m_saved_state);
            approx_state.partial_advance(pCur_node->m_lzdec);
         }

         const bit_cost_t cur_node_total_cost = pCur_node->m_total_cost;
         // This assert includes a fudge factor - make sure we don't overflow our scaled costs.
         LZHAM_ASSERT((cBitCostMax - cur_node_total_cost) > (cBitCostScale * 64));
         const uint cur_node_total_complexity = pCur_node->m_total_complexity;

         const uint lit_pred0 = approx_state.get_pred_char(m_accel, cur_dict_ofs, 1);
         uint is_match_model_index = LZHAM_IS_MATCH_MODEL_INDEX(approx_state.m_cur_state);

         const uint8* pLookahead = &m_accel.m_dict[cur_dict_ofs];

         // rep matches
         uint match_hist_max_len = 0;
         uint match_hist_min_match_len = 1;
         for (uint rep_match_index = 0; rep_match_index < cMatchHistSize; rep_match_index++)
         {
            uint hist_match_len = 0;

            uint dist = approx_state.m_match_hist[rep_match_index];
            if (dist <= find_dict_size)
            {
               const uint comp_pos = static_cast<uint>((m_accel.m_lookahead_pos + cur_lookahead_ofs - dist) & m_accel.m_max_dict_size_mask);
               const uint8* pComp = &m_accel.m_dict[comp_pos];

               for (hist_match_len = 0; hist_match_len < max_admissable_match_len; hist_match_len++)
                  if (pComp[hist_match_len] != pLookahead[hist_match_len])
                     break;
            }

            if (hist_match_len >= match_hist_min_match_len)
            {
               match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

               approx_state.get_rep_match_costs(cur_dict_ofs, lzdec_bitcosts, rep_match_index, match_hist_min_match_len, hist_match_len, is_match_model_index);

               uint rep_match_total_complexity = cur_node_total_complexity + (cRep0Complexity + rep_match_index);
               for (uint l = match_hist_min_match_len; l <= hist_match_len; l++)
               {
#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, l, -((int)rep_match_index + 1));
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                  }
#endif
                  node_state& dst_node = pCur_node[l];

                  bit_cost_t rep_match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];

                  if ((rep_match_total_cost > dst_node.m_total_cost) || ((rep_match_total_cost == dst_node.m_total_cost) && (rep_match_total_complexity >= dst_node.m_total_complexity)))
                     continue;

                  dst_node.m_total_cost = rep_match_total_cost;
                  dst_node.m_total_complexity = rep_match_total_complexity;
                  dst_node.m_parent_index = (uint16)cur_node_index;
                  approx_state.save_partial_state(dst_node.m_saved_state);
                  dst_node.m_lzdec.init(cur_dict_ofs, l, -((int)rep_match_index + 1));
                  dst_node.m_lzdec.m_len = l;

                  pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &dst_node);
               }
            }

            match_hist_min_match_len = CLZBase::cMinMatchLen;
         }

         uint max_match_len = match_hist_max_len;

         if (max_match_len >= m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // full matches
         if (max_admissable_match_len >= CLZBase::cMinMatchLen)
         {
            uint num_full_matches = 0;

            if (match_hist_max_len < 2)
            {
               // Get the nearest len2 match if we didn't find a rep len2.
               uint len2_match_dist = m_accel.get_len2_match(cur_lookahead_ofs);
               if (len2_match_dist)
               {
                  bit_cost_t cost = approx_state.get_len2_match_cost(*this, cur_dict_ofs, len2_match_dist, is_match_model_index);

#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, 2, len2_match_dist);
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == cost);
                  }
#endif

                  node_state& dst_node = pCur_node[2];

                  bit_cost_t match_total_cost = cur_node_total_cost + cost;
                  uint match_total_complexity = cur_node_total_complexity + cShortMatchComplexity;

                  if ((match_total_cost < dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity < dst_node.m_total_complexity)))
                  {
                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, 2, len2_match_dist);

                     pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &dst_node);
                  }

                  max_match_len = 2;
               }
            }

            const uint min_truncate_match_len = max_match_len;

            // Now get all full matches: the nearest matches at each match length. (Actually, we don't
            // always get the nearest match. The match finder favors those matches which have the lowest value
            // in the nibble of each match distance, all other things being equal, to help exploit how the lowest
            // nibble of match distances is separately coded.)
            const dict_match* pMatches = m_accel.find_matches(cur_lookahead_ofs);
            if (pMatches)
            {
               for ( ; ; )
               {
                  uint match_len = pMatches->get_len();
                  LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));
                  match_len = LZHAM_MIN(match_len, max_admissable_match_len);

                  if (match_len > max_match_len)
                  {
                     max_match_len = match_len;

                     match_lens[num_full_matches] = match_len;
                     match_distances[num_full_matches] = pMatches->get_dist();
                     num_full_matches++;
                  }

                  if (pMatches->is_last())
                     break;
                  pMatches++;
               }
            }

            if (num_full_matches)
            {
               uint prev_max_match_len = LZHAM_MAX(1, min_truncate_match_len);
               for (uint full_match_index = 0; full_match_index < num_full_matches; full_match_index++)
               {
                  uint start_len = prev_max_match_len + 1;
                  uint end_len = match_lens[full_match_index];
                  uint match_dist = match_distances[full_match_index];

                  LZHAM_ASSERT(start_len <= end_len);

                  approx_state.get_full_match_costs(*this, cur_dict_ofs, lzdec_bitcosts, match_dist, start_len, end_len, is_match_model_index);

                  for (uint l = start_len; l <= end_len; l++)
                  {
                     uint match_complexity = (l >= cLongMatchComplexityLenThresh) ? cLongMatchComplexity : cShortMatchComplexity;

#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, match_dist);
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node_state& dst_node = pCur_node[l];

                     bit_cost_t match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];
                     uint match_total_complexity = cur_node_total_complexity + match_complexity;

                     if ((match_total_cost > dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity >= dst_node.m_total_complexity)))
                        continue;

                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, l, match_dist);

                     pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &dst_node);
                  }

                  prev_max_match_len = end_len;
               }
            }
         }

         if (max_match_len >= m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // literal
         bit_cost_t lit_cost = approx_state.get_lit_cost(*this, m_accel, cur_dict_ofs, lit_pred0, is_match_model_index);
         bit_cost_t lit_total_cost = cur_node_total_cost + lit_cost;
         uint lit_total_complexity = cur_node_total_complexity + cLitComplexity;
#if LZHAM_VERIFY_MATCH_COSTS
         {
            lzdecision actual_dec(cur_dict_ofs, 0, 0);
            bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
            LZHAM_ASSERT(actual_cost == lit_cost);
         }
#endif
         if ((lit_total_cost < pCur_node[1].m_total_cost) || ((lit_total_cost == pCur_node[1].m_total_cost) && (lit_total_complexity < pCur_node[1].m_total_complexity)))
         {
            pCur_node[1].m_total_cost = lit_total_cost;
            pCur_node[1].m_total_complexity = lit_total_complexity;
            pCur_node[1].m_parent_index = (int16)cur_node_index;
            approx_state.save_partial_state(pCur_node[1].m_saved_state);
            pCur_node[1].m_lzdec.init(cur_dict_ofs, 0, 0);

            pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &pCur_node[1]);
         }

         cur_dict_ofs++;
         cur_lookahead_ofs++;
         cur_node_index++;

      } // graph search

      LZHAM_ASSERT(static_cast<int>(cur_node_index) == (pMax_node_in_graph - pNodes));
      uint bytes_actually_parsed = cur_node_index;

      // Now get the optimal decisions by starting from the goal node.
      // m_best_decisions is filled backwards.
      if (!parse_state.m_best_decisions.try_reserve(bytes_actually_parsed))
      {
         parse_state.m_failed = true;

         memset(pNodes, 0xFF, (pMax_node_in_graph - pNodes + 1) * sizeof(node_state));

         LZHAM_LOG_ERROR(7037);

         return false;
      }

      int node_index = bytes_actually_parsed;
      lzdecision *pDst_dec = parse_state.m_best_decisions.get_ptr();
      do
      {
         LZHAM_ASSERT((node_index >= 0) && (node_index <= (int)cMaxParseGraphNodes));
         node_state& cur_node = pNodes[node_index];

         *pDst_dec++ = cur_node.m_lzdec;

         node_index = cur_node.m_parent_index;

      } while (node_index > 0);

      parse_state.m_best_decisions.try_resize_no_construct(static_cast<uint>(pDst_dec - parse_state.m_best_decisions.get_ptr()));

      parse_state.m_bytes_actually_parsed = bytes_actually_parsed;

      memset(pNodes, 0xFF, (pMax_node_in_graph - pNodes + 1) * sizeof(node_state));

      return true;
   }